

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

vw * VW::initialize(int argc,char **argv,io_buf *model,bool skipModelLoad,
                   trace_message_t trace_listener,void *trace_context)

{
  vw *pvVar1;
  char **in_RSI;
  int in_EDI;
  options_boost_po *unaff_retaddr;
  vw *all;
  options_i *options;
  void *in_stack_00000160;
  trace_message_t in_stack_00000168;
  bool in_stack_00000177;
  io_buf *in_stack_00000178;
  options_i *in_stack_00000180;
  
  operator_new(0x2e8);
  config::options_boost_po::options_boost_po(unaff_retaddr,in_EDI,in_RSI);
  pvVar1 = initialize(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168,
                      in_stack_00000160);
  pvVar1->should_delete_options = true;
  return pvVar1;
}

Assistant:

vw* initialize(
    int argc, char* argv[], io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  options_i* options = new config::options_boost_po(argc, argv);
  vw* all = initialize(*options, model, skipModelLoad, trace_listener, trace_context);

  // When VW is deleted the options object will be cleaned up too.
  all->should_delete_options = true;
  return all;
}